

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Index IVar2;
  Result RVar3;
  void *local_68;
  void *data;
  Enum local_58;
  Address data_size;
  Enum local_50;
  Enum local_4c;
  Enum local_48;
  Index local_44;
  char local_3d;
  Index memory_index;
  uint uStack_38;
  SegmentFlags flags;
  uint local_34;
  uint32_t flags_u32;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_data_segments;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_data_segments = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x83])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&local_28,"data segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags_u32 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x84])();
      bVar1 = Succeeded((Result)flags_u32);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((local_28 == 0) || (IVar2 = NumTotalMemories(this), IVar2 != 0)) {
          for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
            memory_index = (Index)ReadU32Leb128(this,&stack0xffffffffffffffc8,"data segment flags");
            bVar1 = Failed((Result)memory_index);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (2 < uStack_38) {
              PrintError(this,"invalid data segment flags");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_3d = (char)uStack_38;
            local_44 = 0;
            if (local_3d == '\x02') {
              local_48 = (Enum)ReadIndex(this,&local_44,"data segment memory index");
              bVar1 = Failed((Result)local_48);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            local_4c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x85])
                                 (this->delegate_,(ulong)local_34,(ulong)local_44,
                                  (ulong)(local_3d == '\x01'));
            bVar1 = Succeeded((Result)local_4c);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"BeginDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (local_3d != '\x01') {
              local_50 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x86])
                                   (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded((Result)local_50);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"BeginDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              data_size = (Address)ReadI32InitExpr(this,local_34);
              bVar1 = Failed((Result)data_size);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_58 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x87])
                                   (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded((Result)local_58);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"EndDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            RVar3 = ReadBytes(this,&local_68,(Address *)((long)&data + 4),"data segment data");
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x88])
                                    (this->delegate_,(ulong)local_34,local_68,(ulong)data._4_4_);
            bVar1 = Succeeded(RVar3);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnDataSegmentData callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x89])();
            bVar1 = Succeeded(RVar3);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"EndDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8a])();
          bVar1 = Succeeded(RVar3);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndDataSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"data section without memory section");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnDataSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginDataSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  Index num_data_segments;
  CHECK_RESULT(ReadCount(&num_data_segments, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments);
  ERROR_UNLESS(num_data_segments == 0 || NumTotalMemories() > 0,
               "data section without memory section");
  for (Index i = 0; i < num_data_segments; ++i) {
    uint32_t flags_u32;
    CHECK_RESULT(ReadU32Leb128(&flags_u32, "data segment flags"));
    ERROR_UNLESS(flags_u32 <= static_cast<uint32_t>(SegmentFlags::IndexOther),
                 "invalid data segment flags");
    SegmentFlags flags = static_cast<SegmentFlags>(flags_u32);
    Index memory_index(0);
    if (flags == SegmentFlags::IndexOther) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags == SegmentFlags::Passive);
    if (flags != SegmentFlags::Passive) {
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadI32InitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}